

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EmitterBeam::EmitterBeam(EmitterBeam *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmitterBeam_00217a08;
  this->m_ui8BeamDataLength = '\r';
  this->m_ui8EmitterBeamIDNumber = '\0';
  this->m_ui16BeamParamIndex = 0;
  FundamentalParameterData::FundamentalParameterData(&this->m_FundamentalParameterData);
  this->m_ui8BeamFunction = '\0';
  this->m_ui8NumTargetInTrackJamField = '\0';
  this->m_ui8HighDensityTrackJam = '\0';
  BeamStatus::BeamStatus(&this->m_BeamStatus);
  JammingTechnique::JammingTechnique(&this->m_JammingTechnique);
  (this->m_vTrackJamTargets).
  super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vTrackJamTargets).
  super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vTrackJamTargets).
  super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

EmitterBeam::EmitterBeam() :
    DataTypeBase (),
    m_ui8BeamDataLength ( EMITTER_BEAM_SIZE / 4 ),
    m_ui8EmitterBeamIDNumber ( 0u ),
    m_ui16BeamParamIndex ( 0u ),
    m_FundamentalParameterData (),
    m_ui8BeamFunction ( 0u ),
    m_ui8NumTargetInTrackJamField ( 0u ),
    m_ui8HighDensityTrackJam ( 0u ),
#if DIS_VERSION < 7
    m_ui8Padding ( 0u ),
    m_ui32JammingModeSequence ( 0u ),
#elif DIS_VERSION > 6
    m_BeamStatus (),
    m_JammingTechnique (),
#endif
    m_vTrackJamTargets ()
{
}